

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toScientificString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  bool bVar1;
  int8_t iVar2;
  int iVar3;
  int32_t iVar4;
  int *piVar5;
  div_t dVar6;
  int local_5c;
  int iStack_58;
  div_t res;
  int32_t insertIndex;
  int32_t _scale;
  int32_t p;
  int32_t lowerPos;
  int32_t upperPos;
  undefined1 local_19;
  DecimalQuantity *local_18;
  DecimalQuantity *this_local;
  UnicodeString *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (DecimalQuantity *)__return_storage_ptr__;
  UnicodeString::UnicodeString(__return_storage_ptr__);
  bVar1 = isNegative(this);
  if (bVar1) {
    UnicodeString::append(__return_storage_ptr__,L'-');
  }
  if (this->precision == 0) {
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&upperPos,L"0E+0");
    UnicodeString::append(__return_storage_ptr__,(ConstChar16Ptr *)&upperPos,-1);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&upperPos);
  }
  else {
    p = this->precision + this->scale;
    piVar5 = std::min<int>(&p,&this->lOptPos);
    lowerPos = ~this->scale + *piVar5;
    piVar5 = std::max<int>(&this->scale,&this->rOptPos);
    iVar4 = lowerPos;
    iVar3 = *piVar5 - this->scale;
    iVar2 = getDigitPos(this,lowerPos);
    UnicodeString::append(__return_storage_ptr__,iVar2 + 0x30);
    insertIndex = iVar4 + -1;
    if (iVar3 <= insertIndex) {
      UnicodeString::append(__return_storage_ptr__,L'.');
      for (; iVar3 <= insertIndex; insertIndex = insertIndex + -1) {
        iVar2 = getDigitPos(this,insertIndex);
        UnicodeString::append(__return_storage_ptr__,iVar2 + 0x30);
      }
    }
    UnicodeString::append(__return_storage_ptr__,L'E');
    res.rem = lowerPos + this->scale;
    if (res.rem < 0) {
      res.rem = -res.rem;
      UnicodeString::append(__return_storage_ptr__,L'-');
    }
    else {
      UnicodeString::append(__return_storage_ptr__,L'+');
    }
    if (res.rem == 0) {
      UnicodeString::append(__return_storage_ptr__,L'0');
    }
    iVar4 = UnicodeString::length(__return_storage_ptr__);
    while (0 < res.rem) {
      dVar6 = div(res.rem,10);
      iStack_58 = dVar6.rem;
      UnicodeString::insert(__return_storage_ptr__,iVar4,iStack_58 + 0x30);
      local_5c = dVar6.quot;
      res.rem = local_5c;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toScientificString() const {
    U_ASSERT(!isApproximate);
    UnicodeString result;
    if (isNegative()) {
        result.append(u'-');
    }
    if (precision == 0) {
        result.append(u"0E+0", -1);
        return result;
    }
    // NOTE: It is not safe to add to lOptPos (aka maxInt) or subtract from
    // rOptPos (aka -maxFrac) due to overflow.
    int32_t upperPos = std::min(precision + scale, lOptPos) - scale - 1;
    int32_t lowerPos = std::max(scale, rOptPos) - scale;
    int32_t p = upperPos;
    result.append(u'0' + getDigitPos(p));
    if ((--p) >= lowerPos) {
        result.append(u'.');
        for (; p >= lowerPos; p--) {
            result.append(u'0' + getDigitPos(p));
        }
    }
    result.append(u'E');
    int32_t _scale = upperPos + scale;
    if (_scale < 0) {
        _scale *= -1;
        result.append(u'-');
    } else {
        result.append(u'+');
    }
    if (_scale == 0) {
        result.append(u'0');
    }
    int32_t insertIndex = result.length();
    while (_scale > 0) {
        std::div_t res = std::div(_scale, 10);
        result.insert(insertIndex, u'0' + res.rem);
        _scale = res.quot;
    }
    return result;
}